

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::set_session_paused(torrent *this,bool b)

{
  bool bVar1;
  bool bVar2;
  bool paused_before;
  bool b_local;
  torrent *this_local;
  
  if ((bool)((byte)(*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1c) & 1) != b) {
    bVar1 = is_paused(this);
    *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
         *(ulong *)&(this->super_torrent_hot_members).field_0x48 & 0xffffffffefffffff |
         (ulong)b << 0x1c;
    bVar2 = is_paused(this);
    if (bVar1 != bVar2) {
      if (b) {
        do_pause(this,false);
      }
      else {
        do_resume(this);
      }
    }
  }
  return;
}

Assistant:

void torrent::set_session_paused(bool const b)
	{
		if (m_session_paused == b) return;
		bool const paused_before = is_paused();
		m_session_paused = b;

		if (paused_before == is_paused()) return;

		if (b) do_pause();
		else do_resume();
	}